

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O1

FT_Error FT_Glyph_StrokeBorder(FT_Glyph *pglyph,FT_Stroker stroker,FT_Bool inside,FT_Bool destroy)

{
  FT_Outline *outline;
  FT_Error FVar1;
  FT_Orientation FVar2;
  int iVar3;
  undefined7 in_register_00000009;
  FT_OutlineGlyph oglyph;
  FT_Glyph pFVar4;
  undefined8 local_48;
  FT_Glyph copy;
  undefined4 local_38;
  FT_UInt num_contours;
  
  FVar1 = 6;
  if ((((pglyph != (FT_Glyph *)0x0) && (pFVar4 = *pglyph, pFVar4 != (FT_Glyph)0x0)) &&
      (local_38 = (undefined4)CONCAT71(in_register_00000009,destroy),
      pFVar4->clazz == &ft_outline_glyph_class)) &&
     (FVar1 = FT_Glyph_Copy(pFVar4,(FT_Glyph *)&local_48), FVar1 == 0)) {
    pFVar4 = (FT_Glyph)CONCAT44(local_48._4_4_,(FT_UInt)local_48);
    outline = (FT_Outline *)(pFVar4 + 1);
    FVar2 = FT_Outline_Get_Orientation(outline);
    num_contours = CONCAT31(num_contours._1_3_,FVar2 != FT_ORIENTATION_FILL_RIGHT);
    FVar1 = FT_Stroker_ParseOutline(stroker,outline,'\0');
    iVar3 = 3;
    if (FVar1 == 0) {
      num_contours = (FT_UInt)(inside != '\0' ^ (byte)num_contours);
      FT_Stroker_GetBorderCounts
                (stroker,num_contours,(FT_UInt *)&local_48,(FT_UInt *)((long)&copy + 4));
      FT_Outline_Done(pFVar4->library,outline);
      FVar1 = FT_Outline_New(pFVar4->library,(FT_UInt)local_48,copy._4_4_,outline);
      if (FVar1 == 0) {
        *(undefined4 *)&pFVar4[1].library = 0;
        FT_Stroker_ExportBorder(stroker,num_contours,outline);
        iVar3 = 0;
        FVar1 = 0;
      }
      else {
        iVar3 = 3;
      }
    }
    if (iVar3 == 3) {
      FT_Done_Glyph(pFVar4);
      if ((char)local_38 != '\0') {
        return FVar1;
      }
      pFVar4 = (FT_Glyph)0x0;
    }
    else {
      if (iVar3 != 0) {
        return FVar1;
      }
      if ((char)local_38 != '\0') {
        FT_Done_Glyph(*pglyph);
      }
    }
    *pglyph = pFVar4;
  }
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Glyph_StrokeBorder( FT_Glyph    *pglyph,
                         FT_Stroker   stroker,
                         FT_Bool      inside,
                         FT_Bool      destroy )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );
    FT_Glyph  glyph = NULL;

    /* for FT_OUTLINE_GLYPH_CLASS_GET (in PIC mode) */
    FT_Library  library = stroker->library;

    FT_UNUSED( library );


    if ( !pglyph )
      goto Exit;

    glyph = *pglyph;
    if ( !glyph || glyph->clazz != FT_OUTLINE_GLYPH_CLASS_GET )
      goto Exit;

    {
      FT_Glyph  copy;


      error = FT_Glyph_Copy( glyph, &copy );
      if ( error )
        goto Exit;

      glyph = copy;
    }

    {
      FT_OutlineGlyph   oglyph  = (FT_OutlineGlyph)glyph;
      FT_StrokerBorder  border;
      FT_Outline*       outline = &oglyph->outline;
      FT_UInt           num_points, num_contours;


      border = FT_Outline_GetOutsideBorder( outline );
      if ( inside )
      {
        if ( border == FT_STROKER_BORDER_LEFT )
          border = FT_STROKER_BORDER_RIGHT;
        else
          border = FT_STROKER_BORDER_LEFT;
      }

      error = FT_Stroker_ParseOutline( stroker, outline, FALSE );
      if ( error )
        goto Fail;

      FT_Stroker_GetBorderCounts( stroker, border,
                                  &num_points, &num_contours );

      FT_Outline_Done( glyph->library, outline );

      error = FT_Outline_New( glyph->library,
                              num_points,
                              (FT_Int)num_contours,
                              outline );
      if ( error )
        goto Fail;

      outline->n_points   = 0;
      outline->n_contours = 0;

      FT_Stroker_ExportBorder( stroker, border, outline );
    }

    if ( destroy )
      FT_Done_Glyph( *pglyph );

    *pglyph = glyph;
    goto Exit;

  Fail:
    FT_Done_Glyph( glyph );
    glyph = NULL;

    if ( !destroy )
      *pglyph = NULL;

  Exit:
    return error;
  }